

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

PropResult __thiscall
Clasp::DomainHeuristic::propagate(DomainHeuristic *this,Solver *s,Literal param_3,uint32 *aId)

{
  ValueRep VVar1;
  uint32 lev;
  size_type sVar2;
  reference pDVar3;
  uint16 *gPrio;
  reference pFVar4;
  DomainHeuristic *in_RCX;
  Frame *in_RDI;
  uint16 *prio;
  DomAction *a;
  uint32 D;
  uint32 n;
  Frame *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint32 in_stack_ffffffffffffffb4;
  Frame in_stack_ffffffffffffffc0;
  size_type n_00;
  PropResult local_2;
  
  n_00 = *(size_type *)
          &(in_RCX->super_ClaspVsids_t<Clasp::DomScore>).super_DecisionHeuristic.
           _vptr_DecisionHeuristic;
  lev = Solver::decisionLevel((Solver *)0x238286);
  do {
    pDVar3 = bk_lib::
             pod_vector<Clasp::DomainHeuristic::DomAction,_std::allocator<Clasp::DomainHeuristic::DomAction>_>
             ::operator[]((pod_vector<Clasp::DomainHeuristic::DomAction,_std::allocator<Clasp::DomainHeuristic::DomAction>_>
                           *)(in_RDI + 0x14),n_00);
    gPrio = DomainHeuristic::prio
                      ((DomainHeuristic *)
                       CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (Var)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (uint32)in_stack_ffffffffffffffa8);
    VVar1 = Solver::value((Solver *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          (Var)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    if ((VVar1 == '\0') && (*gPrio <= pDVar3->prio)) {
      in_stack_ffffffffffffffb4 = lev;
      applyAction(in_RCX,(Solver *)CONCAT44(n_00,lev),pDVar3,gPrio);
      lev = in_stack_ffffffffffffffb4;
      pFVar4 = bk_lib::
               pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
               ::back((pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
                       *)(in_RDI + 0x16));
      if (in_stack_ffffffffffffffb4 != pFVar4->dl) {
        Solver::addUndoWatch
                  ((Solver *)in_stack_ffffffffffffffc0,(uint32)((ulong)in_RDI >> 0x20),
                   (Constraint *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        in_stack_ffffffffffffffa8 = in_RDI + 0x16;
        Frame::Frame((Frame *)&stack0xffffffffffffffc0,lev,0x7fffffff);
        bk_lib::
        pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>::
        push_back((pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
                   *)in_stack_ffffffffffffffc0,in_RDI);
      }
      bk_lib::
      pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>::
      back((pod_vector<Clasp::DomainHeuristic::Frame,_std::allocator<Clasp::DomainHeuristic::Frame>_>
            *)(in_RDI + 0x16));
      pushUndo((DomainHeuristic *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               &in_stack_ffffffffffffffa8->dl,0);
    }
    sVar2 = n_00 + 1;
    pDVar3 = bk_lib::
             pod_vector<Clasp::DomainHeuristic::DomAction,_std::allocator<Clasp::DomainHeuristic::DomAction>_>
             ::operator[]((pod_vector<Clasp::DomainHeuristic::DomAction,_std::allocator<Clasp::DomainHeuristic::DomAction>_>
                           *)(in_RDI + 0x14),n_00);
    n_00 = sVar2;
  } while (*(long *)pDVar3 < 0);
  Constraint::PropResult::PropResult(&local_2,true,true);
  return local_2;
}

Assistant:

Constraint::PropResult DomainHeuristic::propagate(Solver& s, Literal, uint32& aId) {
	uint32 n = aId;
	uint32 D = s.decisionLevel();
	do {
		DomAction& a = actions_[n];
		uint16& prio = this->prio(a.var, a.mod);
		if (s.value(a.var) == value_free && a.prio >= prio) {
			applyAction(s, a, prio);
			if (D != frames_.back().dl) {
				s.addUndoWatch(D, this);
				frames_.push_back(Frame(D, DomAction::UNDO_NIL));
			}
			pushUndo(frames_.back().head, n);
		}
	} while (actions_[n++].next);
	return PropResult(true, true);
}